

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GyroscopeSensor.cpp
# Opt level: O3

void __thiscall
iDynTree::GyroscopeSensor::GyroscopeSensor(GyroscopeSensor *this,GyroscopeSensor *other)

{
  GyroscopePrivateAttributes *pGVar1;
  pointer pcVar2;
  GyroscopePrivateAttributes *pGVar3;
  
  (this->super_LinkSensor).super_Sensor._vptr_Sensor = (_func_int **)&PTR__GyroscopeSensor_00185a10;
  pGVar3 = (GyroscopePrivateAttributes *)operator_new(0xa8);
  pGVar1 = other->pimpl;
  (pGVar3->name)._M_dataplus._M_p = (pointer)&(pGVar3->name).field_2;
  pcVar2 = (pGVar1->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pGVar3,pcVar2,pcVar2 + (pGVar1->name)._M_string_length);
  iDynTree::Transform::Transform(&pGVar3->link_H_sensor,&pGVar1->link_H_sensor);
  pGVar3->parent_link_index = pGVar1->parent_link_index;
  (pGVar3->parent_link_name)._M_dataplus._M_p = (pointer)&(pGVar3->parent_link_name).field_2;
  pcVar2 = (pGVar1->parent_link_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pGVar3->parent_link_name,pcVar2,
             pcVar2 + (pGVar1->parent_link_name)._M_string_length);
  this->pimpl = pGVar3;
  return;
}

Assistant:

GyroscopeSensor::GyroscopeSensor(const GyroscopeSensor& other):
    pimpl(new GyroscopePrivateAttributes(*(other.pimpl)))
{

}